

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

BDD make_random(int i,int j)

{
  int iVar1;
  BDD high;
  MTBDD MVar2;
  BDD local_30;
  BDD result;
  BDD no;
  BDD yes;
  int j_local;
  int i_local;
  
  if (i == j) {
    iVar1 = rng(0,2);
    _j_local = 0;
    if (iVar1 != 0) {
      _j_local = 0x8000000000000000;
    }
  }
  else {
    high = make_random(i + 1,j);
    local_30 = make_random(i + 1,j);
    iVar1 = rng(0,4);
    switch(iVar1) {
    case 0:
      mtbdd_deref(high);
      break;
    case 1:
      mtbdd_deref(local_30);
      local_30 = high;
      break;
    case 2:
      MVar2 = mtbdd_makenode(i,high,local_30);
      MVar2 = mtbdd_ref(MVar2);
      mtbdd_deref(local_30);
      mtbdd_deref(high);
      local_30 = MVar2;
      break;
    case 3:
    default:
      MVar2 = mtbdd_makenode(i,local_30,high);
      MVar2 = mtbdd_ref(MVar2);
      mtbdd_deref(local_30);
      mtbdd_deref(high);
      local_30 = MVar2;
    }
    _j_local = local_30;
  }
  return _j_local;
}

Assistant:

static inline BDD
make_random(int i, int j)
{
    if (i == j) return rng(0, 2) ? sylvan_true : sylvan_false;

    BDD yes = make_random(i+1, j);
    BDD no = make_random(i+1, j);
    BDD result = sylvan_invalid;

    switch(rng(0, 4)) {
    case 0:
        result = no;
        sylvan_deref(yes);
        break;
    case 1:
        result = yes;
        sylvan_deref(no);
        break;
    case 2:
        result = sylvan_ref(sylvan_makenode(i, yes, no));
        sylvan_deref(no);
        sylvan_deref(yes);
        break;
    case 3:
    default:
        result = sylvan_ref(sylvan_makenode(i, no, yes));
        sylvan_deref(no);
        sylvan_deref(yes);
        break;
    }

    return result;
}